

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O3

uint32_t FACTWave_SetPitch(FACTWave *pWave,int16_t pitch)

{
  FAudioSourceVoice *voice;
  short sVar1;
  uint32_t uVar2;
  double dVar3;
  
  if (pWave == (FACTWave *)0x0) {
    uVar2 = 1;
  }
  else {
    FAudio_PlatformLockMutex(pWave->parentBank->parentEngine->apiLock);
    sVar1 = -0x960;
    if (-0x960 < pitch) {
      sVar1 = pitch;
    }
    if (0x95f < sVar1) {
      sVar1 = 0x960;
    }
    pWave->pitch = sVar1;
    voice = pWave->voice;
    dVar3 = (double)SDL_pow(0x4000000000000000,(double)(int)sVar1 / 1200.0);
    uVar2 = 0;
    FAudioSourceVoice_SetFrequencyRatio(voice,(float)dVar3,0);
    FAudio_PlatformUnlockMutex(pWave->parentBank->parentEngine->apiLock);
  }
  return uVar2;
}

Assistant:

uint32_t FACTWave_SetPitch(FACTWave *pWave, int16_t pitch)
{
	if (pWave == NULL)
	{
		return 1;
	}
	FAudio_PlatformLockMutex(pWave->parentBank->parentEngine->apiLock);
	pWave->pitch = FAudio_clamp(
		pitch,
		FACTPITCH_MIN_TOTAL,
		FACTPITCH_MAX_TOTAL
	);
	FAudioSourceVoice_SetFrequencyRatio(
		pWave->voice,
		(float) FAudio_pow(2.0, pWave->pitch / 1200.0),
		0
	);
	FAudio_PlatformUnlockMutex(pWave->parentBank->parentEngine->apiLock);
	return 0;
}